

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::FileGenerator::PrintFileRuntimePreamble
          (FileGenerator *this,Printer *printer,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *headers_to_import)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  string cpp_symbol;
  string framework_name;
  string local_70;
  string local_50;
  
  io::Printer::Print<char[9],std::__cxx11::string>
            (printer,
             "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
             ,(char (*) [9])"filename",
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this->file_);
  std::__cxx11::string::string((string *)&local_50,"protobuf",(allocator *)&local_70);
  ProtobufFrameworkImportSymbol(&local_70,&local_50);
  io::Printer::Print<char[11],std::__cxx11::string>
            (printer,
             "// This CPP symbol can be defined to use imports that match up to the framework\n// imports needed when using CocoaPods.\n#if !defined($cpp_symbol$)\n #define $cpp_symbol$ 0\n#endif\n\n#if $cpp_symbol$\n"
             ,(char (*) [11])"cpp_symbol",&local_70);
  p_Var2 = (headers_to_import->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(headers_to_import->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var1) {
    do {
      io::Printer::Print<char[7],std::__cxx11::string,char[15],std::__cxx11::string>
                (printer," #import <$framework_name$/$header$>\n",(char (*) [7])"header",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1),
                 (char (*) [15])"framework_name",&local_50);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
  }
  io::Printer::Print<>(printer,"#else\n");
  for (p_Var3 = (headers_to_import->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    io::Printer::Print<char[7],std::__cxx11::string>
              (printer," #import \"$header$\"\n",(char (*) [7])"header",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1));
  }
  io::Printer::Print<>(printer,"#endif\n\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void FileGenerator::PrintFileRuntimePreamble(
    io::Printer* printer, const std::set<string>& headers_to_import) const {
  printer->Print(
      "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "// source: $filename$\n"
      "\n",
      "filename", file_->name());

  const string framework_name(ProtobufLibraryFrameworkName);
  const string cpp_symbol(ProtobufFrameworkImportSymbol(framework_name));

  printer->Print(
      "// This CPP symbol can be defined to use imports that match up to the framework\n"
      "// imports needed when using CocoaPods.\n"
      "#if !defined($cpp_symbol$)\n"
      " #define $cpp_symbol$ 0\n"
      "#endif\n"
      "\n"
      "#if $cpp_symbol$\n",
      "cpp_symbol", cpp_symbol);


  for (std::set<string>::const_iterator iter = headers_to_import.begin();
       iter != headers_to_import.end(); ++iter) {
    printer->Print(
        " #import <$framework_name$/$header$>\n",
        "header", *iter,
        "framework_name", framework_name);
  }

  printer->Print(
      "#else\n");

  for (std::set<string>::const_iterator iter = headers_to_import.begin();
       iter != headers_to_import.end(); ++iter) {
    printer->Print(
        " #import \"$header$\"\n",
        "header", *iter);
  }

  printer->Print(
      "#endif\n"
      "\n");
}